

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

void constructor(LexState *ls,expdesc *t)

{
  FuncState *fs_00;
  int iVar1;
  bool bVar2;
  undefined1 local_58 [8];
  ConsControl cc;
  int pc;
  int line;
  FuncState *fs;
  expdesc *t_local;
  LexState *ls_local;
  
  fs_00 = ls->fs;
  cc._44_4_ = ls->linenumber;
  cc.tostore = luaK_codeABCk(fs_00,OP_NEWTABLE,0,0,0,0);
  luaK_code(fs_00,0);
  cc.nh = 0;
  cc.t._0_4_ = 0;
  cc.t._4_4_ = 0;
  cc.v._16_8_ = t;
  init_exp(t,VNONRELOC,(uint)fs_00->freereg);
  luaK_reserveregs(fs_00,1);
  init_exp((expdesc *)local_58,VVOID,0);
  checknext(ls,0x7b);
  do {
    if ((ls->t).token == 0x7d) break;
    closelistfield(fs_00,(ConsControl *)local_58);
    field(ls,(ConsControl *)local_58);
    iVar1 = testnext(ls,0x2c);
    bVar2 = true;
    if (iVar1 == 0) {
      iVar1 = testnext(ls,0x3b);
      bVar2 = iVar1 != 0;
    }
  } while (bVar2);
  check_match(ls,0x7d,0x7b,cc._44_4_);
  lastlistfield(fs_00,(ConsControl *)local_58);
  luaK_settablesize(fs_00,cc.tostore,(t->u).info,cc.t._4_4_,(int)cc.t);
  return;
}

Assistant:

static void constructor (LexState *ls, expdesc *t) {
  /* constructor -> '{' [ field { sep field } [sep] ] '}'
     sep -> ',' | ';' */
  FuncState *fs = ls->fs;
  int line = ls->linenumber;
  int pc = luaK_codeABC(fs, OP_NEWTABLE, 0, 0, 0);
  ConsControl cc;
  luaK_code(fs, 0);  /* space for extra arg. */
  cc.na = cc.nh = cc.tostore = 0;
  cc.t = t;
  init_exp(t, VNONRELOC, fs->freereg);  /* table will be at stack top */
  luaK_reserveregs(fs, 1);
  init_exp(&cc.v, VVOID, 0);  /* no value (yet) */
  checknext(ls, '{');
  do {
    lua_assert(cc.v.k == VVOID || cc.tostore > 0);
    if (ls->t.token == '}') break;
    closelistfield(fs, &cc);
    field(ls, &cc);
  } while (testnext(ls, ',') || testnext(ls, ';'));
  check_match(ls, '}', '{', line);
  lastlistfield(fs, &cc);
  luaK_settablesize(fs, pc, t->u.info, cc.na, cc.nh);
}